

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_End_TestShell::createTest
          (TEST_TeamCityOutputTest_TestNameEscaped_End_TestShell *this)

{
  TEST_TeamCityOutputTest_TestNameEscaped_End_Test *this_00;
  TEST_TeamCityOutputTest_TestNameEscaped_End_TestShell *this_local;
  
  this_00 = (TEST_TeamCityOutputTest_TestNameEscaped_End_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                         ,0xc0);
  TEST_TeamCityOutputTest_TestNameEscaped_End_Test::TEST_TeamCityOutputTest_TestNameEscaped_End_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_End)
{
	tst->setTestName("'[]\n\r");
	result->currentTestStarted(tst);
	result->currentTestEnded(tst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testFinished name='|'|[|]|n|r' duration='0']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}